

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_pit_color(parser *p)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  undefined8 *puVar3;
  int local_34;
  wchar_t attr;
  char *color;
  pit_color_profile *colors;
  pit_profile *pit;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getsym(p,"color");
    sVar2 = strlen(__s);
    if (sVar2 < 2) {
      local_34 = color_char_to_attr(*__s);
    }
    else {
      local_34 = color_text_to_attr(__s);
    }
    if (local_34 < 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_COLOR;
    }
    else {
      puVar3 = (undefined8 *)mem_zalloc(0x10);
      *(char *)(puVar3 + 1) = (char)local_34;
      *puVar3 = *(undefined8 *)((long)pvVar1 + 0x68);
      *(undefined8 **)((long)pvVar1 + 0x68) = puVar3;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_pit_color(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	struct pit_color_profile *colors;
	const char *color;
	int attr;

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	color = parser_getsym(p, "color");
	if (strlen(color) > 1)
		attr = color_text_to_attr(color);
	else
		attr = color_char_to_attr(color[0]);
	if (attr < 0)
		return PARSE_ERROR_INVALID_COLOR;

	colors = mem_zalloc(sizeof *colors);
	colors->color = attr;
	colors->next = pit->colors;
	pit->colors = colors;
	return PARSE_ERROR_NONE;
}